

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O3

void ssh_initiate_connection_close(Ssh *ssh)

{
  ssh_shutdown_internal(ssh);
  (*ssh->bpp->vt->handle_output)(ssh->bpp);
  ssh->pending_close = true;
  queue_idempotent_callback(&ssh->ic_out_raw);
  ssh->bpp->expect_close = true;
  return;
}

Assistant:

static void ssh_initiate_connection_close(Ssh *ssh)
{
    /* Wind up everything above the BPP. */
    ssh_shutdown_internal(ssh);

    /* Force any remaining queued SSH packets through the BPP, and
     * schedule closing the network socket after they go out. */
    ssh_bpp_handle_output(ssh->bpp);
    ssh->pending_close = true;
    queue_idempotent_callback(&ssh->ic_out_raw);

    /* Now we expect the other end to close the connection too in
     * response, so arrange that we'll receive notification of that
     * via ssh_remote_eof. */
    ssh->bpp->expect_close = true;
}